

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::ssl_is_valid_ech_config_list(bssl *this,Span<const_unsigned_char> ech_config_list)

{
  Span<const_unsigned_char> span;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  bool local_99;
  undefined1 local_98 [7];
  bool supported;
  ECHConfig ech_config;
  CBS child;
  undefined1 local_30 [8];
  CBS cbs;
  Span<const_unsigned_char> ech_config_list_local;
  
  span.size_ = (size_t)ech_config_list.data_;
  span.data_ = (uchar *)this;
  cbs.len = (size_t)this;
  cbs_st::cbs_st((cbs_st *)local_30,span);
  iVar2 = CBS_get_u16_length_prefixed((CBS *)local_30,(CBS *)&ech_config.kem_id);
  if (((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&ech_config.kem_id), sVar3 == 0)) ||
     (sVar3 = CBS_len((CBS *)local_30), sVar3 != 0)) {
    ech_config_list_local.size_._7_1_ = 0;
  }
  else {
    do {
      sVar3 = CBS_len((CBS *)&ech_config.kem_id);
      if (sVar3 == 0) {
        ech_config_list_local.size_._7_1_ = 1;
        break;
      }
      ECHConfig::ECHConfig((ECHConfig *)local_98);
      bVar1 = parse_ech_config((CBS *)&ech_config.kem_id,(ECHConfig *)local_98,&local_99,false);
      if (!bVar1) {
        ech_config_list_local.size_._7_1_ = 0;
      }
      ECHConfig::~ECHConfig((ECHConfig *)local_98);
    } while (bVar1);
  }
  return (bool)(ech_config_list_local.size_._7_1_ & 1);
}

Assistant:

bool ssl_is_valid_ech_config_list(Span<const uint8_t> ech_config_list) {
  CBS cbs = ech_config_list, child;
  if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
      CBS_len(&child) == 0 ||                        //
      CBS_len(&cbs) > 0) {
    return false;
  }
  while (CBS_len(&child) > 0) {
    ECHConfig ech_config;
    bool supported;
    if (!parse_ech_config(&child, &ech_config, &supported,
                          /*all_extensions_mandatory=*/false)) {
      return false;
    }
  }
  return true;
}